

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O1

void vkt::texture::anon_unknown_1::populateTextureCompressedFormatTests
               (TestCaseGroup *compressedTextureTests)

{
  VkFormat VVar1;
  long lVar2;
  TestNode *node;
  long *plVar3;
  long *plVar4;
  long lVar5;
  string nameBase;
  string formatStr;
  Compressed2DTestParameters testParameters;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  long *local_2a8 [2];
  long local_298 [2];
  size_type *local_288;
  long *local_280 [2];
  long local_270 [2];
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  string local_240;
  Program local_220;
  undefined4 uStack_21c;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  long local_1e0;
  TestNode *local_1d8;
  TestContext *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  _func_int **local_1a8;
  FilterMode FStack_1a0;
  FilterMode FStack_19c;
  WrapMode local_198;
  WrapMode WStack_194;
  VkFormat local_190;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> local_188;
  size_type local_170;
  ios_base local_138 [264];
  
  local_1d0 = (compressedTextureTests->super_TestNode).m_testCtx;
  lVar2 = 0;
  local_1d8 = &compressedTextureTests->super_TestNode;
  do {
    local_288 = &DAT_00d68250 + lVar2 * 2;
    lVar5 = 0;
    local_1e0 = lVar2;
    do {
      VVar1 = *(VkFormat *)((long)&DAT_00b84e90 + lVar5);
      local_240._M_dataplus._M_p = (pointer)::vk::getFormatName;
      local_240._M_string_length._0_4_ = VVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      tcu::Format::Enum<vk::VkFormat,_4UL>::toStream
                ((Enum<vk::VkFormat,_4UL> *)&local_240,(ostream *)&local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_200);
      de::toLower(&local_240,(string *)&local_1a8);
      if (local_1a8 != (_func_int **)&local_198) {
        operator_delete(local_1a8,CONCAT44(WStack_194,local_198) + 1);
      }
      util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                ((Texture2DTestCaseParameters *)&local_1a8);
      local_170 = *local_288;
      FStack_1a0 = NEAREST;
      FStack_19c = NEAREST;
      local_220 = PROGRAM_2D_FLOAT;
      local_190 = VVar1;
      if (local_188.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_188.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        _M_realloc_insert<vkt::texture::util::Program>
                  (&local_188,
                   (iterator)
                   local_188.
                   super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_220);
      }
      else {
        *local_188.
         super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
         ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
        local_188.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      node = (TestNode *)operator_new(0xb0);
      local_280[0] = local_270;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_280,local_240._M_dataplus._M_p,
                 local_240._M_dataplus._M_p +
                 CONCAT44(local_240._M_string_length._4_4_,(VkFormat)local_240._M_string_length));
      std::__cxx11::string::append((char *)local_280);
      plVar3 = (long *)std::__cxx11::string::append((char *)local_280);
      local_260 = &local_250;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_250 = *plVar4;
        lStack_248 = plVar3[3];
      }
      else {
        local_250 = *plVar4;
        local_260 = (long *)*plVar3;
      }
      local_258 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,(char *)local_260,&local_2a9);
      local_2a8[0] = local_298;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a8,local_200,local_1f8 + (long)local_200);
      std::__cxx11::string::append((char *)local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,(char *)local_2a8[0],&local_2aa);
      tcu::TestCase::TestCase
                ((TestCase *)node,local_1d0,(char *)CONCAT44(uStack_21c,local_220),
                 (char *)local_1c8[0]);
      node->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d68280;
      node[1]._vptr_TestNode = local_1a8;
      node[1].m_testCtx = (TestContext *)CONCAT44(FStack_19c,FStack_1a0);
      *(ulong *)((long)&node[1].m_testCtx + 4) = CONCAT44(local_198,FStack_19c);
      *(ulong *)((long)&node[1].m_name._M_dataplus._M_p + 4) = CONCAT44(local_190,WStack_194);
      std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
                ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  *)&node[1].m_name.field_2,&local_188);
      node[1].m_description._M_string_length = local_170;
      tcu::TestNode::addChild(local_1d8,node);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0],local_298[0] + 1);
      }
      if ((long *)CONCAT44(uStack_21c,local_220) != local_210) {
        operator_delete((long *)CONCAT44(uStack_21c,local_220),local_210[0] + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      if (local_280[0] != local_270) {
        operator_delete(local_280[0],local_270[0] + 1);
      }
      if (local_188.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.
                        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.
                              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.
                              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x28);
    lVar2 = local_1e0 + 1;
  } while (local_1e0 == 0);
  return;
}

Assistant:

void populateTextureCompressedFormatTests (tcu::TestCaseGroup* compressedTextureTests)
{
	tcu::TestContext&	testCtx	= compressedTextureTests->getTestContext();

	// ETC2 and EAC compressed formats.
	const struct {
		const VkFormat	format;
	} etc2Formats[] =
	{
		{ VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK	},

		{ VK_FORMAT_EAC_R11_UNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11_SNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11G11_UNORM_BLOCK		},
		{ VK_FORMAT_EAC_R11G11_SNORM_BLOCK		},
	};

	const struct {
		const int	width;
		const int	height;
		const char*	name;
	} sizes[] =
	{
		{ 128, 64, "pot"  },
		{ 51,  65, "npot" },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		const string	formatStr	= de::toString(getFormatStr(etc2Formats[formatNdx].format));
		const string	nameBase	= de::toLower(formatStr.substr(10));

		Compressed2DTestParameters	testParameters;
		testParameters.format		= etc2Formats[formatNdx].format;
		testParameters.width		= sizes[sizeNdx].width;
		testParameters.height		= sizes[sizeNdx].height;
		testParameters.minFilter	= tcu::Sampler::NEAREST;
		testParameters.magFilter	= tcu::Sampler::NEAREST;
		testParameters.programs.push_back(PROGRAM_2D_FLOAT);

		compressedTextureTests->addChild(new TextureTestCase<Compressed2DTestInstance>(testCtx, (nameBase + "_2d_" + sizes[sizeNdx].name).c_str(), (formatStr + ", TEXTURETYPE_2D").c_str(), testParameters));
	}
}